

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void __thiscall wallet::CMerkleTx::Unserialize<DataStream>(CMerkleTx *this,DataStream *s)

{
  long lVar1;
  DataStream *this_00;
  long in_FS_OFFSET;
  int nIndex;
  vector<uint256,_std::allocator<uint256>_> vMerkleBranch;
  CTransactionRef tx;
  uint256 hashBlock;
  uint256 *in_stack_ffffffffffffff38;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>
  *in_stack_ffffffffffffff40;
  DataStream *in_stack_ffffffffffffff48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff38);
  uint256::uint256(in_stack_ffffffffffffff38);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff38);
  TransactionSerParams::operator()
            ((TransactionSerParams *)in_stack_ffffffffffffff48,
             (shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff40);
  DataStream::operator>>(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  DataStream::operator>>(in_stack_ffffffffffffff48,(uint256 *)in_stack_ffffffffffffff40);
  this_00 = DataStream::operator>>
                      (in_stack_ffffffffffffff48,
                       (vector<uint256,_std::allocator<uint256>_> *)in_stack_ffffffffffffff40);
  DataStream::operator>>(this_00,(int *)in_stack_ffffffffffffff40);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)this_00);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        CTransactionRef tx;
        uint256 hashBlock;
        std::vector<uint256> vMerkleBranch;
        int nIndex;

        s >> TX_WITH_WITNESS(tx) >> hashBlock >> vMerkleBranch >> nIndex;
    }